

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtprawpacket.h
# Opt level: O3

void __thiscall jrtplib::RTPRawPacket::~RTPRawPacket(RTPRawPacket *this)

{
  RTPMemoryManager *pRVar1;
  RTPAddress *pRVar2;
  
  (this->super_RTPMemoryObject)._vptr_RTPMemoryObject = (_func_int **)&PTR__RTPRawPacket_0013c070;
  if (this->packetdata != (uint8_t *)0x0) {
    pRVar1 = (this->super_RTPMemoryObject).mgr;
    if (pRVar1 == (RTPMemoryManager *)0x0) {
      operator_delete__(this->packetdata);
    }
    else {
      (**(code **)(*(long *)pRVar1 + 0x18))();
    }
  }
  pRVar2 = this->senderaddress;
  if (pRVar2 != (RTPAddress *)0x0) {
    pRVar1 = (this->super_RTPMemoryObject).mgr;
    if (pRVar1 == (RTPMemoryManager *)0x0) {
      (*pRVar2->_vptr_RTPAddress[4])(pRVar2);
    }
    else {
      (*pRVar2->_vptr_RTPAddress[3])(pRVar2);
      (**(code **)(*(long *)pRVar1 + 0x18))(pRVar1,pRVar2);
    }
  }
  this->packetdata = (uint8_t *)0x0;
  this->senderaddress = (RTPAddress *)0x0;
  return;
}

Assistant:

inline RTPRawPacket::~RTPRawPacket()
{
	DeleteData();
}